

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_app.cpp
# Opt level: O3

void __thiscall Clasp::Cli::ClaspAppBase::handleStartOptions(ClaspAppBase *this,ClaspFacade *clasp)

{
  string *psVar1;
  size_t __n;
  ulong uVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  BasicProgramAdapter *this_00;
  AspifInput *this_01;
  LitSpan *in_RCX;
  sockaddr *__addr;
  StreamType **this_02;
  AspifInput *pAVar6;
  pointer __s1;
  Lit_t lit;
  int local_4c;
  AtomSpan local_48;
  LitSpan local_38;
  
  bVar3 = ClaspFacade::incremental(clasp);
  if (!bVar3) {
    ClaspCliConfig::releaseOptions(&this->claspConfig_);
  }
  if (((this->claspAppOpts_).compute != 0) &&
     (iVar5 = (**(code **)(*(long *)((clasp->builder_).ptr_ & 0xfffffffffffffffe) + 0x40))(),
     iVar5 == 2)) {
    local_4c = -(this->claspAppOpts_).compute;
    local_38.first = &local_4c;
    local_48.first = (uint *)0x0;
    local_48.size = 0;
    in_RCX = &local_38;
    local_38.size = 1;
    Asp::LogicProgram::addRule
              ((LogicProgram *)((clasp->builder_).ptr_ & 0xfffffffffffffffe),(Head_t)0x0,&local_48,
               in_RCX);
  }
  if ((this->claspAppOpts_).lemmaIn._M_string_length == 0) {
    return;
  }
  iVar5 = (**(code **)(*(long *)((clasp->builder_).ptr_ & 0xfffffffffffffffe) + 0x40))();
  if (iVar5 == 2) {
    this_00 = (BasicProgramAdapter *)operator_new(0x18);
    Asp::LogicProgramAdapter::LogicProgramAdapter
              ((LogicProgramAdapter *)this_00,
               (LogicProgram *)((clasp->builder_).ptr_ & 0xfffffffffffffffe));
  }
  else {
    this_00 = (BasicProgramAdapter *)operator_new(0x38);
    BasicProgramAdapter::BasicProgramAdapter
              (this_00,(ProgramBuilder *)((clasp->builder_).ptr_ & 0xfffffffffffffffe));
  }
  this_01 = (AspifInput *)operator_new(0x240);
  Potassco::AspifInput::AspifInput(this_01,(AbstractProgram *)((ulong)this_00 & 0xfffffffffffffffe))
  ;
  (this_01->super_ProgramReader)._vptr_ProgramReader = (_func_int **)&PTR__LemmaIn_001e5f20;
  this_01[1].super_ProgramReader._vptr_ProgramReader =
       (_func_int **)((ulong)this_00 & 0xfffffffffffffffe);
  this_02 = &this_01[1].super_ProgramReader.str_;
  std::ifstream::ifstream(this_02);
  psVar1 = &(this->claspAppOpts_).lemmaIn;
  iVar5 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar5 == 0) goto LAB_00116a4e;
  __n = (this->claspAppOpts_).lemmaIn._M_string_length;
  if (__n == DAT_001eba50) {
    if (__n == 0) goto LAB_00116a4e;
    __s1 = (psVar1->_M_dataplus)._M_p;
    iVar5 = bcmp(__s1,stdinStr_abi_cxx11_,__n);
    if (iVar5 == 0) goto LAB_00116a4e;
  }
  else {
    __s1 = (psVar1->_M_dataplus)._M_p;
  }
  std::ifstream::open((char *)this_02,(_Ios_Openmode)__s1);
LAB_00116a4e:
  cVar4 = std::__basic_file<char>::is_open();
  if (cVar4 == '\0') {
    this_02 = (StreamType **)&std::cin;
  }
  iVar5 = Potassco::ProgramReader::accept
                    ((ProgramReader *)this_01,(int)this_02,__addr,(socklen_t *)in_RCX);
  if ((char)iVar5 != '\0') {
    uVar2 = (this->lemmaIn_).ptr_;
    pAVar6 = (AspifInput *)(uVar2 & 0xfffffffffffffffe);
    if (((uVar2 & 1) != 0 && this_01 != pAVar6) &&
       ((this->lemmaIn_).ptr_ = (uintp)pAVar6, pAVar6 != (AspifInput *)0x0)) {
      (*(pAVar6->super_ProgramReader)._vptr_ProgramReader[1])();
    }
    (this->lemmaIn_).ptr_ = (ulong)this_01 | 1;
    return;
  }
  Potassco::fail(-2,
                 "Clasp::Cli::ClaspAppBase::handleStartOptions(ClaspFacade &)::LemmaIn::LemmaIn(const std::string &, PrgAdapter *)"
                 ,0x1e4,"accept(getStream())","\'lemma-in\': invalid input file!",0);
}

Assistant:

void ClaspAppBase::handleStartOptions(ClaspFacade& clasp) {
	if (!clasp.incremental()) {
		claspConfig_.releaseOptions();
	}
	if (claspAppOpts_.compute && clasp.program()->type() == Problem_t::Asp) {
		Potassco::Lit_t lit = Potassco::neg(claspAppOpts_.compute);
		static_cast<Asp::LogicProgram*>(clasp.program())->addRule(Potassco::Head_t::Disjunctive, Potassco::toSpan<Potassco::Atom_t>(), Potassco::toSpan(&lit, 1));
	}
	if (!claspAppOpts_.lemmaIn.empty()) {
		class LemmaIn : public Potassco::AspifInput {
		public:
			typedef Potassco::AbstractProgram PrgAdapter;
			LemmaIn(const std::string& fn, PrgAdapter* prg) : Potassco::AspifInput(*prg), prg_(prg) {
				if (!isStdIn(fn)) { file_.open(fn.c_str()); }
				POTASSCO_REQUIRE(accept(getStream()), "'lemma-in': invalid input file!");
			}
			~LemmaIn() { delete prg_; }
		private:
			std::istream& getStream() { return file_.is_open() ? file_ : std::cin; }
			PrgAdapter*   prg_;
			std::ifstream file_;
		};
		SingleOwnerPtr<Potassco::AbstractProgram> prgTemp;
		if (clasp.program()->type() == Problem_t::Asp) { prgTemp = new Asp::LogicProgramAdapter(*static_cast<Asp::LogicProgram*>(clasp.program())); }
		else { prgTemp = new BasicProgramAdapter(*clasp.program()); }
		lemmaIn_ = new LemmaIn(claspAppOpts_.lemmaIn, prgTemp.release());
	}
}